

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

shared_ptr<cppnet::Timer> cppnet::MakeTimer1Min(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cppnet::Timer> sVar2;
  shared_ptr<cppnet::TimerContainer> timer;
  shared_ptr<cppnet::TimerContainer> sec_sub;
  TIME_UNIT local_5c;
  __shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2> local_58;
  void *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_58._M_ptr = (element_type *)0x0;
  local_5c = TU_MILLISECOND;
  std::make_shared<cppnet::TimerContainer,decltype(nullptr),cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&local_48,(TIME_UNIT *)&local_58,&local_5c);
  local_5c = TU_SECOND;
  std::
  make_shared<cppnet::TimerContainer,std::shared_ptr<cppnet::TimerContainer>&,cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            ((shared_ptr<cppnet::TimerContainer> *)&local_58,(TIME_UNIT *)&local_48,&local_5c);
  std::__shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&local_58);
  std::__weak_ptr<cppnet::TimerContainer,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<cppnet::TimerContainer,(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_48 + 0x38),&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  _Var1._M_pi = local_58._M_refcount._M_pi;
  local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_Timer = (_func_int **)local_58._M_ptr;
  in_RDI[1]._vptr_Timer = (_func_int **)_Var1._M_pi;
  local_58._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppnet::Timer>)
         sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Timer> MakeTimer1Min() {
    auto sec_sub = std::make_shared<TimerContainer>(nullptr, TU_MILLISECOND, TU_SECOND);
    auto timer = std::make_shared<TimerContainer>(sec_sub, TU_SECOND, TU_MINUTE);
    sec_sub->SetRootTimer(timer);
    return timer;
}